

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall
Args::CmdLine::savePositionalArguments(CmdLine *this,String *word,bool splitted,bool valuePrepended)

{
  byte bVar1;
  iterator __x;
  byte in_CL;
  byte in_DL;
  string *in_RSI;
  iterator it;
  String tmp;
  Context *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  allocator local_71;
  string local_70 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50 [3];
  string local_38 [38];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  std::__cxx11::string::string(local_38,in_RSI);
  if (((local_11 & 1) != 0) &&
     (std::__cxx11::string::append((ulong)local_38,'\x01'), (local_12 & 1) != 0)) {
    local_50[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Context::next_abi_cxx11_(in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(local_50);
    std::__cxx11::string::append(local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,2,'-',&local_71);
  bVar1 = std::operator!=(in_stack_ffffffffffffff50,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if ((bVar1 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                in_stack_ffffffffffffff58);
  }
  while (in_stack_ffffffffffffff66 =
              Context::atEnd((Context *)
                             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,
                                                     in_stack_ffffffffffffff60))),
        ((in_stack_ffffffffffffff66 ^ 0xff) & 1) != 0) {
    __x = Context::next_abi_cxx11_(in_stack_ffffffffffffff48);
    local_80._M_current = __x._M_current;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                __x._M_current);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void savePositionalArguments( const String & word, bool splitted, bool valuePrepended )
	{
		auto tmp = word;

		if( splitted )
		{
			tmp.append( 1, '=' );

			if( valuePrepended )
				tmp.append( *m_context.next() );
		}

		if( tmp != String( 2, '-' ) )
			m_positional.push_back( tmp );

		while( !m_context.atEnd() )
		{
			auto it = m_context.next();

			m_positional.push_back( *it );
		}
	}